

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O1

void __thiscall aiMetadata::~aiMetadata(aiMetadata *this)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  
  if (this->mKeys != (aiString *)0x0) {
    operator_delete__(this->mKeys);
  }
  this->mKeys = (aiString *)0x0;
  if (this->mValues != (aiMetadataEntry *)0x0) {
    if (this->mNumProperties != 0) {
      lVar2 = 8;
      uVar3 = 0;
      do {
        if ((*(uint *)((long)this->mValues + lVar2 + -8) < 7) &&
           (pvVar1 = *(void **)((long)&this->mValues->mType + lVar2), pvVar1 != (void *)0x0)) {
          operator_delete(pvVar1);
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (uVar3 < this->mNumProperties);
    }
    if (this->mValues != (aiMetadataEntry *)0x0) {
      operator_delete__(this->mValues);
    }
    this->mValues = (aiMetadataEntry *)0x0;
  }
  return;
}

Assistant:

~aiMetadata() {
        delete [] mKeys;
        mKeys = nullptr;
        if (mValues) {
            // Delete each metadata entry
            for (unsigned i=0; i<mNumProperties; ++i) {
                void* data = mValues[i].mData;
                switch (mValues[i].mType) {
                case AI_BOOL:
                    delete static_cast< bool* >( data );
                    break;
                case AI_INT32:
                    delete static_cast< int32_t* >( data );
                    break;
                case AI_UINT64:
                    delete static_cast< uint64_t* >( data );
                    break;
                case AI_FLOAT:
                    delete static_cast< float* >( data );
                    break;
                case AI_DOUBLE:
                    delete static_cast< double* >( data );
                    break;
                case AI_AISTRING:
                    delete static_cast< aiString* >( data );
                    break;
                case AI_AIVECTOR3D:
                    delete static_cast< aiVector3D* >( data );
                    break;
#ifndef SWIG
                case FORCE_32BIT:
#endif
                default:
                    break;
                }
            }

            // Delete the metadata array
            delete [] mValues;
            mValues = nullptr;
        }
    }